

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

Own<kj::_::ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>_>
 __thiscall
kj::
heap<kj::_::ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>::Connection>>,kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>::Connection>>
          (kj *this,
          Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>
          *params)

{
  Connection *pCVar1;
  ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>
  *pIVar2;
  ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>
  *extraout_RDX;
  ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>
  *extraout_RDX_00;
  ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>
  *extraout_RDX_01;
  Own<kj::_::ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>_>
  OVar3;
  ExceptionOr<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>
  local_188;
  
  pIVar2 = (ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>
            *)operator_new(0x178);
  local_188.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_188.value.ptr.disposer = params->disposer;
  local_188.value.ptr.ptr = params->ptr;
  params->ptr = (Connection *)0x0;
  _::
  ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>
  ::ImmediatePromiseNode(pIVar2,&local_188);
  pCVar1 = local_188.value.ptr.ptr;
  *(undefined8 **)this =
       &_::
        HeapDisposer<kj::_::ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>::Connection>>>
        ::instance;
  *(ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>
    **)(this + 8) = pIVar2;
  pIVar2 = extraout_RDX;
  if (local_188.value.ptr.ptr != (Connection *)0x0) {
    local_188.value.ptr.ptr = (Connection *)0x0;
    (**(local_188.value.ptr.disposer)->_vptr_Disposer)
              (local_188.value.ptr.disposer,
               (_func_int *)
               ((long)&(pCVar1->super_Connection)._vptr_Connection +
               (long)(pCVar1->super_Connection)._vptr_Connection[-2]));
    pIVar2 = extraout_RDX_00;
  }
  if (local_188.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_188.super_ExceptionOrValue.exception.ptr.field_1.value);
    pIVar2 = extraout_RDX_01;
  }
  OVar3.ptr = pIVar2;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}